

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PathDescriptionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PathDescriptionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::PathSuffixSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *args_2,Token *args_3,Token *args_4,
          PathSuffixSyntax *args_5,Token *args_6)

{
  Token edgeIdentifier;
  Token openParen;
  Token pathOperator;
  Token closeParen;
  PathDescriptionSyntax *pPVar1;
  PathSuffixSyntax *in_RCX;
  undefined8 *in_RDX;
  Token *in_RSI;
  Info *in_R8;
  undefined8 *in_R9;
  long in_stack_00000010;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  
  pPVar1 = (PathDescriptionSyntax *)
           allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  openParen.info = (Info *)*in_RDX;
  openParen._0_8_ = in_R8->location;
  edgeIdentifier.info = (Info *)in_R8->rawTextPtr;
  edgeIdentifier._0_8_ = in_R9[1];
  pathOperator.info = in_R8;
  pathOperator._0_8_ = in_R9;
  closeParen.info = (Info *)in_RSI;
  closeParen._0_8_ = in_RDX;
  slang::syntax::PathDescriptionSyntax::PathDescriptionSyntax
            ((PathDescriptionSyntax *)*in_R9,openParen,edgeIdentifier,
             *(SeparatedSyntaxList<slang::syntax::NameSyntax> **)(in_stack_00000010 + 8),*in_RSI,
             pathOperator,in_RCX,closeParen);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }